

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookptravltree.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Node *ptr;
  Node *ptr_00;
  Node *ptr_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  long lVar4;
  int iVar5;
  PtrAVLTree list;
  size_t size;
  Node n [20];
  
  list.m_root = (Node *)0x0;
  size = 0;
  iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = 0x28;
    lVar4 = 0;
    do {
      if (lVar4 + 0x38 == 0x498) {
        cookmem::PtrAVLTree::add(&list,n,10);
        cookmem::PtrAVLTree::add(&list,n + 1,0x14);
        cookmem::PtrAVLTree::add(&list,n + 2,0x1e);
        cookmem::PtrAVLTree::add(&list,n + 3,0x28);
        cookmem::PtrAVLTree::add(&list,n + 4,0x32);
        cookmem::PtrAVLTree::add(&list,n + 5,0x14);
        cookmem::PtrAVLTree::add(&list,n + 6,0x28);
        cookmem::PtrAVLTree::add(&list,n + 7,0x50);
        ptr = n + 8;
        cookmem::PtrAVLTree::add(&list,ptr,0x96);
        cookmem::PtrAVLTree::add(&list,n + 9,0xfa);
        cookmem::PtrAVLTree::add(&list,n + 10,0x3c);
        cookmem::PtrAVLTree::add(&list,n + 0xb,0xdc);
        cookmem::PtrAVLTree::add(&list,n + 0xc,0x14a);
        cookmem::PtrAVLTree::add(&list,n + 0xd,0x1b8);
        ptr_00 = n + 0xe;
        cookmem::PtrAVLTree::add(&list,ptr_00,0x226);
        cookmem::PtrAVLTree::add(&list,n + 0xf,0x140);
        cookmem::PtrAVLTree::add(&list,n + 0x10,0x154);
        cookmem::PtrAVLTree::add(&list,n + 0x11,0x1ae);
        cookmem::PtrAVLTree::add(&list,n + 0x12,10);
        ptr_01 = n + 0x13;
        cookmem::PtrAVLTree::add(&list,ptr_01,0x14);
        if (list.m_root != (Node *)0x0) {
          cookmem::PtrAVLTree::printGraph(&list);
          iVar2 = 0x45;
          lVar4 = 0;
          goto LAB_00101461;
        }
        iVar2 = 0x40;
        break;
      }
      bVar1 = cookmem::PtrAVLTree::contains(&list,(void *)((long)n[0].dummy + lVar4));
      lVar4 = lVar4 + 0x38;
    } while (!bVar1);
  }
  else {
    iVar2 = 0x24;
  }
  goto LAB_0010121a;
  while (bVar1 = cookmem::PtrAVLTree::contains(&list,(void *)((long)n[0].dummy + lVar4)),
        lVar4 = lVar4 + 0x38, !bVar1) {
LAB_001018de:
    if (lVar4 + 0x38 == 0x498) {
      cookmem::PtrAVLTree::add(&list,n,10);
      cookmem::PtrAVLTree::add(&list,n + 1,0x14);
      cookmem::PtrAVLTree::add(&list,n + 2,0x1e);
      cookmem::PtrAVLTree::add(&list,n + 3,0x28);
      cookmem::PtrAVLTree::add(&list,n + 4,0x32);
      cookmem::PtrAVLTree::add(&list,n + 5,0x14);
      cookmem::PtrAVLTree::add(&list,n + 6,0x28);
      cookmem::PtrAVLTree::add(&list,n + 7,0x50);
      cookmem::PtrAVLTree::add(&list,n + 8,0x96);
      cookmem::PtrAVLTree::add(&list,n + 9,0xfa);
      cookmem::PtrAVLTree::add(&list,n + 10,0x3c);
      cookmem::PtrAVLTree::add(&list,n + 0xb,0xdc);
      cookmem::PtrAVLTree::add(&list,n + 0xc,0x14a);
      cookmem::PtrAVLTree::add(&list,n + 0xd,0x1b8);
      cookmem::PtrAVLTree::add(&list,n + 0xe,0x226);
      cookmem::PtrAVLTree::add(&list,n + 0xf,0x140);
      cookmem::PtrAVLTree::add(&list,n + 0x10,0x154);
      cookmem::PtrAVLTree::add(&list,n + 0x11,0x1ae);
      cookmem::PtrAVLTree::add(&list,n + 0x12,10);
      cookmem::PtrAVLTree::add(&list,n + 0x13,0x14);
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 8));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0xe));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0x13));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 5));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 1));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 7));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 2));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0xf));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0xc));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0x10));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0x11));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 4));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 10));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0xd));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0xb));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 9));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 0x12));
      cookmem::PtrAVLTree::remove(&list,(char *)n);
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 6));
      cookmem::PtrAVLTree::remove(&list,(char *)(n + 3));
      iVar5 = 0xbd;
      if (list.m_root == (Node *)0x0) {
        return 0;
      }
      goto LAB_00101bde;
    }
  }
  iVar5 = 0x90;
LAB_00101bde:
  poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  iVar2 = 200;
  goto LAB_00101258;
  while (bVar1 = cookmem::PtrAVLTree::contains(&list,(void *)((long)n[0].dummy + lVar4)),
        lVar4 = lVar4 + 0x38, bVar1) {
LAB_00101461:
    if (lVar4 + 0x38 == 0x498) {
      size = 100;
      iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
      if (ptr == (Node *)CONCAT44(extraout_var_00,iVar2)) {
        bVar1 = cookmem::PtrAVLTree::contains(&list,ptr);
        if (bVar1) {
          iVar2 = 0x49;
        }
        else {
          size = 0x226;
          iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
          if (ptr_00 == (Node *)CONCAT44(extraout_var_01,iVar2)) {
            bVar1 = cookmem::PtrAVLTree::contains(&list,ptr_00);
            if (bVar1) {
              iVar2 = 0x4c;
            }
            else {
              size = 0x14;
              iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
              if (ptr_01 == (Node *)CONCAT44(extraout_var_02,iVar2)) {
                bVar1 = cookmem::PtrAVLTree::contains(&list,ptr_01);
                if (bVar1) {
                  iVar2 = 0x4f;
                }
                else {
                  size = 0x14;
                  iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                  if (n + 5 == (Node *)CONCAT44(extraout_var_03,iVar2)) {
                    bVar1 = cookmem::PtrAVLTree::contains(&list,n + 5);
                    if (bVar1) {
                      iVar2 = 0x51;
                    }
                    else {
                      size = 0x14;
                      iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                      if (n + 1 == (Node *)CONCAT44(extraout_var_04,iVar2)) {
                        bVar1 = cookmem::PtrAVLTree::contains(&list,n + 1);
                        if (bVar1) {
                          iVar2 = 0x53;
                        }
                        else {
                          size = 0x50;
                          iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                          if (n + 7 == (Node *)CONCAT44(extraout_var_05,iVar2)) {
                            size = 0x19;
                            iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                            if (n + 2 == (Node *)CONCAT44(extraout_var_06,iVar2)) {
                              size = 10000;
                              iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                              if (CONCAT44(extraout_var_07,iVar2) == 0) {
                                size = 300;
                                iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                                if (n + 0xf == (Node *)CONCAT44(extraout_var_08,iVar2)) {
                                  size = 300;
                                  iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                                  if (n + 0xc == (Node *)CONCAT44(extraout_var_09,iVar2)) {
                                    size = 300;
                                    iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                                    if (n + 0x10 == (Node *)CONCAT44(extraout_var_10,iVar2)) {
                                      size = 300;
                                      iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                                      if (n + 0x11 == (Node *)CONCAT44(extraout_var_11,iVar2)) {
                                        size = 0x2d;
                                        iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                                        if (n + 4 == (Node *)CONCAT44(extraout_var_12,iVar2)) {
                                          size = 0x2d;
                                          iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size);
                                          if (n + 10 == (Node *)CONCAT44(extraout_var_13,iVar2)) {
                                            size = 300;
                                            iVar2 = cookmem::PtrAVLTree::remove(&list,(char *)&size)
                                            ;
                                            if (n + 0xd == (Node *)CONCAT44(extraout_var_14,iVar2))
                                            {
                                              size = 200;
                                              iVar2 = cookmem::PtrAVLTree::remove
                                                                (&list,(char *)&size);
                                              if (n + 0xb == (Node *)CONCAT44(extraout_var_15,iVar2)
                                                 ) {
                                                if (size == 0xdc) {
                                                  size = 200;
                                                  iVar2 = cookmem::PtrAVLTree::remove
                                                                    (&list,(char *)&size);
                                                  if (n + 9 == (Node *)CONCAT44(extraout_var_16,
                                                                                iVar2)) {
                                                    size = 10;
                                                    iVar2 = cookmem::PtrAVLTree::remove
                                                                      (&list,(char *)&size);
                                                    if (n + 0x12 ==
                                                        (Node *)CONCAT44(extraout_var_17,iVar2)) {
                                                      size = 10;
                                                      iVar2 = cookmem::PtrAVLTree::remove
                                                                        (&list,(char *)&size);
                                                      if (n == (Node *)CONCAT44(extraout_var_18,
                                                                                iVar2)) {
                                                        size = 10;
                                                        iVar2 = cookmem::PtrAVLTree::remove
                                                                          (&list,(char *)&size);
                                                        if (n + 6 == (Node *)CONCAT44(
                                                  extraout_var_19,iVar2)) {
                                                    size = 10;
                                                    iVar2 = cookmem::PtrAVLTree::remove
                                                                      (&list,(char *)&size);
                                                    if (n + 3 == (Node *)CONCAT44(extraout_var_20,
                                                                                  iVar2)) {
                                                      if (list.m_root == (Node *)0x0) {
                                                        size = 0;
                                                        iVar2 = cookmem::PtrAVLTree::remove
                                                                          (&list,(char *)&size);
                                                        if (CONCAT44(extraout_var_21,iVar2) == 0) {
                                                          list.m_root = (Node *)0x0;
                                                          cookmem::PtrAVLTree::add(&list,n,10);
                                                          size = 10;
                                                          cookmem::PtrAVLTree::remove
                                                                    (&list,(char *)&size);
                                                          size = 0;
                                                          cookmem::PtrAVLTree::add
                                                                    ((PtrAVLTree *)&size,n,10);
                                                          cookmem::PtrAVLTree::remove
                                                                    ((PtrAVLTree *)&size,(char *)n);
                                                          list.m_root = (Node *)0x0;
                                                          size = 0;
                                                          iVar2 = cookmem::PtrAVLTree::remove
                                                                            (&list,(char *)&size);
                                                          iVar5 = 0x8c;
                                                          if (CONCAT44(extraout_var_22,iVar2) != 0)
                                                          goto LAB_00101bde;
                                                          lVar4 = 0;
                                                          goto LAB_001018de;
                                                        }
                                                        iVar2 = 0x67;
                                                      }
                                                      else {
                                                        iVar2 = 0x66;
                                                      }
                                                    }
                                                    else {
                                                      iVar2 = 100;
                                                    }
                                                  }
                                                  else {
                                                    iVar2 = 99;
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = 0x62;
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = 0x61;
                                                  }
                                                  }
                                                  else {
                                                    iVar2 = 0x60;
                                                  }
                                                }
                                                else {
                                                  iVar2 = 0x5f;
                                                }
                                              }
                                              else {
                                                iVar2 = 0x5e;
                                              }
                                            }
                                            else {
                                              iVar2 = 0x5d;
                                            }
                                          }
                                          else {
                                            iVar2 = 0x5c;
                                          }
                                        }
                                        else {
                                          iVar2 = 0x5b;
                                        }
                                      }
                                      else {
                                        iVar2 = 0x5a;
                                      }
                                    }
                                    else {
                                      iVar2 = 0x59;
                                    }
                                  }
                                  else {
                                    iVar2 = 0x58;
                                  }
                                }
                                else {
                                  iVar2 = 0x57;
                                }
                              }
                              else {
                                iVar2 = 0x56;
                              }
                            }
                            else {
                              iVar2 = 0x55;
                            }
                          }
                          else {
                            iVar2 = 0x54;
                          }
                        }
                      }
                      else {
                        iVar2 = 0x52;
                      }
                    }
                  }
                  else {
                    iVar2 = 0x50;
                  }
                }
              }
              else {
                iVar2 = 0x4e;
              }
            }
          }
          else {
            iVar2 = 0x4b;
          }
        }
      }
      else {
        iVar2 = 0x48;
      }
      break;
    }
  }
LAB_0010121a:
  poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  iVar2 = 0xc5;
LAB_00101258:
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 1;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());
    ASSERT_EQ (0, test2 ());
    ASSERT_EQ (0, test3 ());
    ASSERT_EQ (0, test4 ());
    return 0;
}